

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool wallet::LoadKey(CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  const_iterator __position;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  __last;
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  long in_FS_OFFSET;
  exception *e;
  bool fSkipCheck;
  failure *anon_var_0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchKey;
  CPrivKey pkey;
  CKey key;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  uint256 hash;
  CPubKey vchPubKey;
  CKey *in_stack_fffffffffffffe28;
  CKey *in_stack_fffffffffffffe30;
  undefined6 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 in_stack_fffffffffffffe3f;
  undefined1 in_stack_fffffffffffffe4b;
  int in_stack_fffffffffffffe4c;
  undefined1 fSkipCheck_00;
  CPubKey *in_stack_fffffffffffffe50;
  CPrivKey *in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffe60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe8c;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_secure_allocator<unsigned_char>_>_>
  in_stack_fffffffffffffe90;
  const_iterator in_stack_fffffffffffffe98;
  byte local_101;
  CPrivKey local_e0;
  CPubKey local_c8 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe68,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe60._M_current,
             (char *)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe4c,(bool)in_stack_fffffffffffffe4b);
  fSkipCheck_00 = (undefined1)((uint)in_stack_fffffffffffffe4c >> 0x18);
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe28);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
             (CPubKey *)in_stack_fffffffffffffe30);
  uVar1 = CPubKey::IsValid((CPubKey *)in_stack_fffffffffffffe28);
  if (!(bool)uVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,
                        CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
               &in_stack_fffffffffffffe30->fCompressed);
    local_101 = 0;
    goto LAB_002dacd4;
  }
  CKey::CKey(in_stack_fffffffffffffe28);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
  uint256::uint256((uint256 *)in_stack_fffffffffffffe28);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
             (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
  DataStream::operator>>
            ((DataStream *)
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
             (uint256 *)in_stack_fffffffffffffe30);
  uVar2 = base_blob<256U>::IsNull
                    ((base_blob<256U> *)
                     CONCAT17(in_stack_fffffffffffffe3f,
                              CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
  if ((bool)uVar2) {
LAB_002daaee:
    bVar3 = CKey::Load((CKey *)in_stack_fffffffffffffe60._M_current,in_stack_fffffffffffffe58,
                       in_stack_fffffffffffffe50,(bool)fSkipCheck_00);
    if (bVar3) {
      CWallet::GetOrCreateLegacyDataSPKM
                ((CWallet *)
                 CONCAT17(in_stack_fffffffffffffe3f,
                          CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
      in_stack_fffffffffffffe3f =
           LegacyDataSPKM::LoadKey
                     ((LegacyDataSPKM *)
                      CONCAT17(in_stack_fffffffffffffe3f,
                               CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                      in_stack_fffffffffffffe30,(CPubKey *)in_stack_fffffffffffffe28);
      if ((bool)in_stack_fffffffffffffe3f) {
        bVar3 = false;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe3f,
                            CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                   &in_stack_fffffffffffffe30->fCompressed);
        local_101 = 0;
        bVar3 = true;
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,
                          CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                 &in_stack_fffffffffffffe30->fCompressed);
      local_101 = 0;
      bVar3 = true;
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe28);
    uVar4 = CPubKey::size((CPubKey *)in_stack_fffffffffffffe28);
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe28)
    ;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (in_stack_fffffffffffffe68,(size_type)in_stack_fffffffffffffe60._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe30);
    CPubKey::begin((CPubKey *)in_stack_fffffffffffffe28);
    CPubKey::end((CPubKey *)
                 CONCAT17(in_stack_fffffffffffffe3f,
                          CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
    __position._M_current._4_2_ = in_stack_fffffffffffffe8c;
    __position._M_current._0_4_ = uVar4;
    __position._M_current._6_1_ = uVar2;
    __position._M_current._7_1_ = uVar1;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffe60._M_current,__position,(uchar *)in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50->vch);
    in_stack_fffffffffffffe58 = &local_e0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe30);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)CONCAT17(in_stack_fffffffffffffe3f,
                           CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe50 = local_c8;
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe30)
    ;
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)in_stack_fffffffffffffe30)
    ;
    __last._M_current._4_2_ = in_stack_fffffffffffffe8c;
    __last._M_current._0_4_ = uVar4;
    __last._M_current._6_1_ = uVar2;
    __last._M_current._7_1_ = uVar1;
    in_stack_fffffffffffffe60 =
         std::vector<unsigned_char,std::allocator<unsigned_char>>::
         insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,secure_allocator<unsigned_char>>>,void>
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffffe50,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                    __last);
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe58);
    bVar3 = ::operator!=((base_blob<256U> *)
                         CONCAT17(in_stack_fffffffffffffe3f,
                                  CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                         (base_blob<256U> *)in_stack_fffffffffffffe30);
    fSkipCheck_00 = bVar3;
    if (bVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe3f,
                          CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)),
                 &in_stack_fffffffffffffe30->fCompressed);
      local_101 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffe3f,
                        CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
    if (!bVar3) goto LAB_002daaee;
  }
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,in_stack_fffffffffffffe38)));
  CKey::~CKey(in_stack_fffffffffffffe28);
  if (bVar3 == false) {
    local_101 = 1;
  }
LAB_002dacd4:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_101 & 1);
}

Assistant:

bool LoadKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CPubKey vchPubKey;
        ssKey >> vchPubKey;
        if (!vchPubKey.IsValid())
        {
            strErr = "Error reading wallet database: CPubKey corrupt";
            return false;
        }
        CKey key;
        CPrivKey pkey;
        uint256 hash;

        ssValue >> pkey;

        // Old wallets store keys as DBKeys::KEY [pubkey] => [privkey]
        // ... which was slow for wallets with lots of keys, because the public key is re-derived from the private key
        // using EC operations as a checksum.
        // Newer wallets store keys as DBKeys::KEY [pubkey] => [privkey][hash(pubkey,privkey)], which is much faster while
        // remaining backwards-compatible.
        try
        {
            ssValue >> hash;
        }
        catch (const std::ios_base::failure&) {}

        bool fSkipCheck = false;

        if (!hash.IsNull())
        {
            // hash pubkey/privkey to accelerate wallet load
            std::vector<unsigned char> vchKey;
            vchKey.reserve(vchPubKey.size() + pkey.size());
            vchKey.insert(vchKey.end(), vchPubKey.begin(), vchPubKey.end());
            vchKey.insert(vchKey.end(), pkey.begin(), pkey.end());

            if (Hash(vchKey) != hash)
            {
                strErr = "Error reading wallet database: CPubKey/CPrivKey corrupt";
                return false;
            }

            fSkipCheck = true;
        }

        if (!key.Load(pkey, vchPubKey, fSkipCheck))
        {
            strErr = "Error reading wallet database: CPrivKey corrupt";
            return false;
        }
        if (!pwallet->GetOrCreateLegacyDataSPKM()->LoadKey(key, vchPubKey))
        {
            strErr = "Error reading wallet database: LegacyDataSPKM::LoadKey failed";
            return false;
        }
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}